

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-array-type.cpp
# Opt level: O0

Up __thiscall yactfr::DynamicLengthArrayType::_clone(DynamicLengthArrayType *this)

{
  DataType *__fn;
  int in_ECX;
  void *__child_stack;
  ArrayType *in_RSI;
  void *in_R8;
  undefined1 local_38 [8];
  DataLocation local_30;
  DynamicLengthArrayType *this_local;
  
  this_local = this;
  local_30._pathElems.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = DataType::alignment((DataType *)in_RSI);
  __fn = ArrayType::elementType(in_RSI);
  DataType::clone((DataType *)(local_38 + 8),(__fn *)__fn,__child_stack,in_ECX,in_R8);
  DataType::attributes((DataType *)in_RSI);
  internal::tryCloneAttrs((MapItem *)local_38);
  create<unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)((long)&local_30._pathElems.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl + 8),
             (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             ((long)&local_30._pathElems.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl + 4),(DataLocation *)(local_38 + 8),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (in_RSI + 1));
  std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>::
  unique_ptr<yactfr::DynamicLengthArrayType_const,std::default_delete<yactfr::DynamicLengthArrayType_const>,void>
            ((unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>> *)this,
             (unique_ptr<const_yactfr::DynamicLengthArrayType,_std::default_delete<const_yactfr::DynamicLengthArrayType>_>
              *)((long)&local_30._pathElems.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 8));
  std::
  unique_ptr<const_yactfr::DynamicLengthArrayType,_std::default_delete<const_yactfr::DynamicLengthArrayType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::DynamicLengthArrayType,_std::default_delete<const_yactfr::DynamicLengthArrayType>_>
                 *)((long)&local_30._pathElems.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl + 8));
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_38);
  std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::~unique_ptr
            ((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
             (local_38 + 8));
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DynamicLengthArrayType::_clone() const
{
    return DynamicLengthArrayType::create(this->alignment(), this->elementType().clone(), _lenLoc,
                                          internal::tryCloneAttrs(this->attributes()));
}